

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O2

Span<const_unsigned_char> __thiscall
bssl::SSLAEADContext::GetAdditionalData
          (SSLAEADContext *this,uint8_t *storage,uint8_t type,uint16_t record_version,
          uint64_t seqnum,size_t plaintext_len,Span<const_unsigned_char> header)

{
  Span<const_unsigned_char> SVar1;
  size_t sStack_8;
  
  if ((this->field_0x26a & 0x10) == 0) {
    *(uint64_t *)storage =
         seqnum >> 0x38 | (seqnum & 0xff000000000000) >> 0x28 | (seqnum & 0xff0000000000) >> 0x18 |
         (seqnum & 0xff00000000) >> 8 | (seqnum & 0xff000000) << 8 | (seqnum & 0xff0000) << 0x18 |
         (seqnum & 0xff00) << 0x28 | seqnum << 0x38;
    storage[8] = type;
    storage[9] = (uint8_t)(record_version >> 8);
    storage[10] = (uint8_t)record_version;
    if ((this->field_0x26a & 8) == 0) {
      *(ushort *)(storage + 0xb) = (ushort)plaintext_len << 8 | (ushort)plaintext_len >> 8;
      sStack_8 = 0xd;
    }
    else {
      sStack_8 = 0xb;
    }
    SVar1.size_ = sStack_8;
    SVar1.data_ = storage;
    return SVar1;
  }
  return header;
}

Assistant:

Span<const uint8_t> SSLAEADContext::GetAdditionalData(
    uint8_t storage[13], uint8_t type, uint16_t record_version, uint64_t seqnum,
    size_t plaintext_len, Span<const uint8_t> header) {
  if (ad_is_header_) {
    return header;
  }

  CRYPTO_store_u64_be(storage, seqnum);
  size_t len = 8;
  storage[len++] = type;
  storage[len++] = static_cast<uint8_t>((record_version >> 8));
  storage[len++] = static_cast<uint8_t>(record_version);
  if (!omit_length_in_ad_) {
    storage[len++] = static_cast<uint8_t>((plaintext_len >> 8));
    storage[len++] = static_cast<uint8_t>(plaintext_len);
  }
  return Span(storage, len);
}